

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::RaceSuccessfulPromiseNode<void>::getNoError
          (RaceSuccessfulPromiseNode<void> *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> local_1a0;
  
  local_1a0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a0.value.ptr.isSet = true;
  ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a0);
  if (local_1a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1a0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getNoError(ExceptionOrValue &output) noexcept override {
    output.as<_::Void>() = _::Void();
  }